

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Equalizer.cpp
# Opt level: O2

int Equalizer::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  BiquadFilter *pBVar1;
  uint uVar2;
  Data *data;
  BiquadFilter *pBVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  float fVar12;
  float decaySpeed;
  float fVar13;
  float fVar14;
  
  data = (Data *)UnityAudioEffectState::GetEffectData<Equalizer::EffectData>(state);
  fVar12 = (float)(state->field_0).field_0.samplerate;
  pBVar1 = data->FilterL;
  uVar7 = 0;
  pBVar3 = pBVar1;
  if (0 < inchannels) {
    uVar7 = (ulong)(uint)inchannels;
  }
  while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
    SetupFilterCoeffs(data,pBVar3 + -0x10,pBVar3 + -8,pBVar3,fVar12);
    pBVar3 = pBVar3 + 1;
  }
  decaySpeed = powf(10.0,((float)length * data->p[0xc] * 0.05) / fVar12);
  fVar12 = data->p[0xb];
  if (0.5 <= fVar12) {
    FFTAnalyzer::AnalyzeInput(&data->analyzer,inbuffer,inchannels,length,decaySpeed);
  }
  fVar13 = powf(10.0,data->p[0] * 0.05);
  uVar10 = 0;
  uVar7 = 0;
  if (0 < outchannels) {
    uVar7 = (ulong)(uint)outchannels;
  }
  uVar4 = 0;
  for (uVar6 = 0; pBVar3 = pBVar1, uVar8 = uVar7, uVar5 = uVar4, uVar9 = uVar10, uVar6 != length;
      uVar6 = uVar6 + 1) {
    while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
      uVar2 = (data->random).seed * 0x19660d + 0x3c6ef35f;
      (data->random).seed = uVar2;
      fVar14 = BiquadFilter::Process
                         (pBVar3 + -0x10,
                          (float)((uVar2 >> 0x10 ^ uVar2) & 0xff) * 1e-09 + inbuffer[uVar9]);
      fVar14 = BiquadFilter::Process(pBVar3 + -8,fVar14);
      fVar14 = BiquadFilter::Process(pBVar3,fVar14);
      outbuffer[uVar5] = fVar14 * fVar13;
      pBVar3 = pBVar3 + 1;
      uVar5 = uVar5 + 1;
      uVar9 = uVar9 + 1;
    }
    uVar4 = uVar4 + outchannels;
    uVar10 = uVar10 + inchannels;
  }
  if (0.5 <= fVar12) {
    FFTAnalyzer::AnalyzeOutput(&data->analyzer,outbuffer,outchannels,length,decaySpeed);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        float sr = (float)state->samplerate;
        for (int i = 0; i < inchannels; i++)
            SetupFilterCoeffs(data, &data->FilterH[i], &data->FilterP[i], &data->FilterL[i], sr);

        float specDecay = powf(10.0f, 0.05f * data->p[P_SpectrumDecay] * length / sr);
        bool calcSpectrum = (data->p[P_ShowSpectrum] >= 0.5f);
        if (calcSpectrum)
            data->analyzer.AnalyzeInput(inbuffer, inchannels, length, specDecay);

        const float masterGain = powf(10.0f, data->p[P_MasterGain] * 0.05f);
        for (unsigned int n = 0; n < length; n++)
        {
            for (int i = 0; i < outchannels; i++)
            {
                float killdenormal = (float)(data->random.Get() & 255) * 1.0e-9f;
                float y = inbuffer[n * inchannels + i] + killdenormal;
                y = data->FilterH[i].Process(y);
                y = data->FilterP[i].Process(y);
                y = data->FilterL[i].Process(y);
                outbuffer[n * outchannels + i] = y * masterGain;
            }
        }

        if (calcSpectrum)
            data->analyzer.AnalyzeOutput(outbuffer, outchannels, length, specDecay);

        return UNITY_AUDIODSP_OK;
    }